

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walWriteToLog(WalWriter *p,void *pContent,int iAmt,sqlite3_int64 iOffset)

{
  int iVar1;
  int iVar2;
  int iFirstAmt;
  int rc;
  sqlite3_int64 iOffset_local;
  void *pvStack_20;
  int iAmt_local;
  void *pContent_local;
  WalWriter *p_local;
  
  _iFirstAmt = iOffset;
  iOffset_local._4_4_ = iAmt;
  pvStack_20 = pContent;
  if ((iOffset < p->iSyncPoint) && (p->iSyncPoint <= iOffset + iAmt)) {
    iVar1 = (int)p->iSyncPoint - (int)iOffset;
    iVar2 = sqlite3OsWrite(p->pFd,pContent,iVar1,iOffset);
    if (iVar2 != 0) {
      return iVar2;
    }
    _iFirstAmt = iVar1 + iOffset;
    iOffset_local._4_4_ = iAmt - iVar1;
    pvStack_20 = (void *)((long)pContent + (long)iVar1);
    iVar1 = sqlite3OsSync(p->pFd,p->syncFlags & 0x13);
    if (iOffset_local._4_4_ == 0) {
      return iVar1;
    }
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  iVar1 = sqlite3OsWrite(p->pFd,pvStack_20,iOffset_local._4_4_,_iFirstAmt);
  return iVar1;
}

Assistant:

static int walWriteToLog(
  WalWriter *p,              /* WAL to write to */
  void *pContent,            /* Content to be written */
  int iAmt,                  /* Number of bytes to write */
  sqlite3_int64 iOffset      /* Start writing at this offset */
){
  int rc;
  if( iOffset<p->iSyncPoint && iOffset+iAmt>=p->iSyncPoint ){
    int iFirstAmt = (int)(p->iSyncPoint - iOffset);
    rc = sqlite3OsWrite(p->pFd, pContent, iFirstAmt, iOffset);
    if( rc ) return rc;
    iOffset += iFirstAmt;
    iAmt -= iFirstAmt;
    pContent = (void*)(iFirstAmt + (char*)pContent);
    assert( p->syncFlags & (SQLITE_SYNC_NORMAL|SQLITE_SYNC_FULL) );
    rc = sqlite3OsSync(p->pFd, p->syncFlags & SQLITE_SYNC_MASK);
    if( iAmt==0 || rc ) return rc;
  }
  rc = sqlite3OsWrite(p->pFd, pContent, iAmt, iOffset);
  return rc;
}